

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O0

int brynet::net::HTTPParser::sMessageBegin(http_parser *hp)

{
  HTTPParser *httpParser;
  http_parser *hp_local;
  
  *(undefined1 *)((long)hp->data + 0x7b) = 1;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return 0;
}

Assistant:

int HTTPParser::sMessageBegin(http_parser* hp)
{
    HTTPParser* httpParser = (HTTPParser*)hp->data;
    httpParser->mLastWasValue = true;
    httpParser->mCurrentField.clear();
    httpParser->mCurrentValue.clear();

    return 0;
}